

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.hpp
# Opt level: O2

void __thiscall
Diligent::TextureBase<Diligent::EngineGLImplTraits>::CreateDefaultViews
          (TextureBase<Diligent::EngineGLImplTraits> *this)

{
  TEXTURE_FORMAT Format;
  int iVar1;
  IMemoryAllocator *pIVar2;
  undefined4 extraout_var;
  BIND_FLAGS BVar3;
  char (*Args_1) [27];
  uint uVar4;
  bool bVar5;
  Uint8 ViewIdx;
  Uint32 NumDefaultViews;
  anon_class_40_5_9f9a65d9 CreateDefaultView;
  TextureViewImplType **ppDefaultViews;
  string msg_1;
  
  if (this->m_pDefaultViews != (void *)0x0) {
    FormatString<char[44]>
              ((string *)&CreateDefaultView,
               (char (*) [44])"Default views have already been initialized");
    DebugAssertionFailed
              ((Char *)CreateDefaultView.TexFmtAttribs,"CreateDefaultViews",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
               ,0xb8);
    std::__cxx11::string::~string((string *)&CreateDefaultView);
  }
  Format = (this->
           super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
           ).m_Desc.Format;
  if (Format != TEX_FORMAT_UNKNOWN) {
    BVar3 = (this->
            super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
            ).m_Desc.BindFlags;
    uVar4 = (BVar3 & (BIND_FLAG_LAST|BIND_UNORDERED_ACCESS|BIND_DEPTH_STENCIL|BIND_RENDER_TARGET|
                     BIND_SHADER_RESOURCE)) - (BVar3 >> 1 & 0x454);
    uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333330);
    uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f) * 0x1010101 >> 0x18;
    if (uVar4 != 0) {
      NumDefaultViews = uVar4;
      if (uVar4 == 1) {
        bVar5 = false;
      }
      else {
        pIVar2 = GetRawAllocator();
        iVar1 = (**pIVar2->_vptr_IMemoryAllocator)
                          (pIVar2,(ulong)(uVar4 << 3),"Default texture view array",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
                           ,0xc6);
        this->m_pDefaultViews = (void *)CONCAT44(extraout_var,iVar1);
        memset((void *)CONCAT44(extraout_var,iVar1),0,(ulong)(uVar4 << 3));
        BVar3 = (this->
                super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                ).m_Desc.BindFlags &
                (BIND_FLAG_LAST|BIND_UNORDERED_ACCESS|BIND_DEPTH_STENCIL|BIND_RENDER_TARGET|
                BIND_SHADER_RESOURCE);
        Format = (this->
                 super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                 ).m_Desc.Format;
        bVar5 = (BVar3 & BVar3 - BIND_VERTEX_BUFFER) != BIND_NONE;
      }
      if (bVar5) {
        ppDefaultViews = (TextureViewImplType **)this->m_pDefaultViews;
      }
      else {
        ppDefaultViews = (TextureViewImplType **)&this->m_pDefaultViews;
      }
      CreateDefaultView.TexFmtAttribs = GetTextureFormatAttribs(Format);
      Args_1 = (char (*) [27])&ViewIdx;
      ViewIdx = '\0';
      CreateDefaultView.NumDefaultViews = &NumDefaultViews;
      BVar3 = (this->
              super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
              ).m_Desc.BindFlags;
      CreateDefaultView.this = this;
      CreateDefaultView.ViewIdx = (Uint8 *)Args_1;
      CreateDefaultView.ppDefaultViews = &ppDefaultViews;
      if ((BVar3 & BIND_SHADER_RESOURCE) != BIND_NONE) {
        CreateDefaultViews::anon_class_40_5_9f9a65d9::operator()
                  (&CreateDefaultView,TEXTURE_VIEW_SHADER_RESOURCE);
        BVar3 = (this->
                super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                ).m_Desc.BindFlags;
      }
      if ((BVar3 & BIND_RENDER_TARGET) != BIND_NONE) {
        CreateDefaultViews::anon_class_40_5_9f9a65d9::operator()
                  (&CreateDefaultView,TEXTURE_VIEW_RENDER_TARGET);
        BVar3 = (this->
                super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                ).m_Desc.BindFlags;
      }
      if ((BVar3 & BIND_DEPTH_STENCIL) != BIND_NONE) {
        CreateDefaultViews::anon_class_40_5_9f9a65d9::operator()
                  (&CreateDefaultView,TEXTURE_VIEW_DEPTH_STENCIL);
        BVar3 = (this->
                super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                ).m_Desc.BindFlags;
      }
      if ((char)BVar3 < '\0') {
        CreateDefaultViews::anon_class_40_5_9f9a65d9::operator()
                  (&CreateDefaultView,TEXTURE_VIEW_UNORDERED_ACCESS);
        BVar3 = (this->
                super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                ).m_Desc.BindFlags;
      }
      if ((BVar3 >> 0xb & 1) != 0) {
        CreateDefaultViews::anon_class_40_5_9f9a65d9::operator()
                  (&CreateDefaultView,TEXTURE_VIEW_SHADING_RATE);
      }
      if (NumDefaultViews != ViewIdx) {
        FormatString<char[26],char[27]>
                  (&msg_1,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"ViewIdx == NumDefaultViews",Args_1);
        DebugAssertionFailed
                  (msg_1._M_dataplus._M_p,"CreateDefaultViews",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
                   ,0x123);
        std::__cxx11::string::~string((string *)&msg_1);
      }
    }
  }
  return;
}

Assistant:

void CreateDefaultViews()
    {
        VERIFY(m_pDefaultViews == nullptr, "Default views have already been initialized");

        if (this->m_Desc.Format == TEX_FORMAT_UNKNOWN)
        {
            // Happens when creating dummy OpenGL textures
            return;
        }

        const Uint32 NumDefaultViews = GetNumDefaultViews();
        if (NumDefaultViews == 0)
            return;

        if (NumDefaultViews > 1)
        {
            m_pDefaultViews = ALLOCATE(GetRawAllocator(), "Default texture view array", TextureViewImplType*, NumDefaultViews);
            memset(m_pDefaultViews, 0, sizeof(TextureViewImplType*) * NumDefaultViews);
        }
        TextureViewImplType** ppDefaultViews = GetDefaultViewsArrayPtr();

        const TextureFormatAttribs& TexFmtAttribs = GetTextureFormatAttribs(this->m_Desc.Format);

        Uint8 ViewIdx = 0;

        auto CreateDefaultView = [&](TEXTURE_VIEW_TYPE ViewType) //
        {
            TextureViewDesc ViewDesc;
            ViewDesc.ViewType = ViewType;

            if (TexFmtAttribs.IsTypeless)
            {
                ViewDesc.Format = GetDefaultTextureViewFormat(this->m_Desc, ViewType);
                if (ViewDesc.Format == TEX_FORMAT_UNKNOWN)
                {
                    return;
                }
            }

            std::string ViewName;
            switch (ViewType)
            {
                case TEXTURE_VIEW_SHADER_RESOURCE:
                    if ((this->m_Desc.MiscFlags & MISC_TEXTURE_FLAG_GENERATE_MIPS) != 0)
                        ViewDesc.Flags |= TEXTURE_VIEW_FLAG_ALLOW_MIP_MAP_GENERATION;
                    ViewName = "Default SRV of texture '";
                    break;

                case TEXTURE_VIEW_RENDER_TARGET:
                    ViewName = "Default RTV of texture '";
                    break;

                case TEXTURE_VIEW_DEPTH_STENCIL:
                    ViewName = "Default DSV of texture '";
                    break;

                case TEXTURE_VIEW_UNORDERED_ACCESS:
                    ViewDesc.AccessFlags = UAV_ACCESS_FLAG_READ_WRITE;

                    ViewName = "Default UAV of texture '";
                    break;

                case TEXTURE_VIEW_SHADING_RATE:
                    ViewDesc.AccessFlags = UAV_ACCESS_FLAG_READ_WRITE;

                    ViewName = "Default VRS view of texture '";
                    break;

                default:
                    UNEXPECTED("Unexpected texture type");
            }
            ViewName += this->m_Desc.Name;
            ViewName += '\'';
            ViewDesc.Name = ViewName.c_str();

            VERIFY_EXPR(ViewIdx < NumDefaultViews);
            TextureViewImplType*& pView = ppDefaultViews[ViewIdx];
            CreateViewInternal(ViewDesc, reinterpret_cast<ITextureView**>(&pView), true);
            DEV_CHECK_ERR(pView != nullptr, "Failed to create default view for texture '", this->m_Desc.Name, "'.");
            DEV_CHECK_ERR(pView->GetDesc().ViewType == ViewType, "Unexpected view type.");

            m_ViewIndices[ViewType] = ViewIdx++;
        };

        if (this->m_Desc.BindFlags & BIND_SHADER_RESOURCE)
        {
            CreateDefaultView(TEXTURE_VIEW_SHADER_RESOURCE);
        }

        if (this->m_Desc.BindFlags & BIND_RENDER_TARGET)
        {
            CreateDefaultView(TEXTURE_VIEW_RENDER_TARGET);
        }

        if (this->m_Desc.BindFlags & BIND_DEPTH_STENCIL)
        {
            CreateDefaultView(TEXTURE_VIEW_DEPTH_STENCIL);
        }

        if (this->m_Desc.BindFlags & BIND_UNORDERED_ACCESS)
        {
            CreateDefaultView(TEXTURE_VIEW_UNORDERED_ACCESS);
        }

        if (this->m_Desc.BindFlags & BIND_SHADING_RATE)
        {
            CreateDefaultView(TEXTURE_VIEW_SHADING_RATE);
        }

        VERIFY_EXPR(ViewIdx == NumDefaultViews);
    }